

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# empty.h
# Opt level: O1

bool ezy::detail::
     impl_empty<ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,ezy::detail::concatenated_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,std::vector<int,std::allocator<int>>>,ezy::experimental::keeper<ezy::experimental::reference_category_tag,std::vector<int,std::allocator<int>>>>const>,ezy::to_string_fn_const&>>
               (long *t)

{
  bool bVar1;
  iterator_concatenator<const_std::vector<int,_std::allocator<int>_>,_const_std::vector<int,_std::allocator<int>_>_>
  local_50;
  long local_30;
  iterator_concatenator<const_std::vector<int,_std::allocator<int>_>,_const_std::vector<int,_std::allocator<int>_>_>
  local_28;
  long local_8;
  
  local_50.tracker.ranges.
  super__Tuple_impl<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>_>
  .
  super__Head_base<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>,_false>
  ._M_head_impl._M_data = (reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>)*t;
  local_30 = t[1];
  local_28.tracker.current.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  .
  super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
  ._M_head_impl._M_current =
       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
       (((vector<int,_std::allocator<int>_> *)
        local_50.tracker.ranges.
        super__Tuple_impl<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>_>
        .
        super__Head_base<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>,_false>
        ._M_head_impl._M_data)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_28.tracker.ranges.
  super__Tuple_impl<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>_>
  .super__Tuple_impl<1UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>_>.
  super__Head_base<1UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>,_false>
  ._M_head_impl._M_data =
       (_Head_base<1UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>,_false>
        )(((vector<int,_std::allocator<int>_> *)
          ((long)local_50.tracker.ranges.
                 super__Tuple_impl<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>_>
                 .
                 super__Head_base<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>,_false>
                 ._M_head_impl._M_data + 0x18))->super__Vector_base<int,_std::allocator<int>_>).
         _M_impl.super__Vector_impl_data._M_start;
  local_28.tracker.current.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  .
  super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  .
  super__Head_base<1UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
  ._M_head_impl._M_current =
       *(_Head_base<1UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
         *)local_28.tracker.ranges.
           super__Tuple_impl<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>_>
           .
           super__Tuple_impl<1UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>_>
           .
           super__Head_base<1UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>,_false>
           ._M_head_impl._M_data;
  local_50.tracker.current.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  .
  super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
  ._M_head_impl._M_current =
       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
       (((vector<int,_std::allocator<int>_> *)
        local_50.tracker.ranges.
        super__Tuple_impl<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>_>
        .
        super__Head_base<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>,_false>
        ._M_head_impl._M_data)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_50.tracker.ranges.
  super__Tuple_impl<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>_>
  .super__Tuple_impl<1UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>_>.
  super__Head_base<1UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>,_false>
  ._M_head_impl._M_data =
       (_Head_base<1UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>,_false>
        )(((vector<int,_std::allocator<int>_> *)
          ((long)local_50.tracker.ranges.
                 super__Tuple_impl<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>_>
                 .
                 super__Head_base<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>,_false>
                 ._M_head_impl._M_data + 0x18))->super__Vector_base<int,_std::allocator<int>_>).
         _M_impl.super__Vector_impl_data._M_start;
  local_50.tracker.current.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  .
  super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  .
  super__Head_base<1UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
  ._M_head_impl._M_current =
       (_Head_base<1UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
        )((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
         ((long)local_50.tracker.ranges.
                super__Tuple_impl<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>_>
                .
                super__Tuple_impl<1UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>_>
                .
                super__Head_base<1UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>,_false>
                ._M_head_impl._M_data + 8))->_M_current;
  local_28.tracker.ranges.
  super__Tuple_impl<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>_>
  .
  super__Head_base<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>,_false>
  ._M_head_impl._M_data =
       local_50.tracker.ranges.
       super__Tuple_impl<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>_>
       .
       super__Head_base<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>,_false>
       ._M_head_impl._M_data;
  local_8 = local_30;
  bVar1 = iterator_concatenator<const_std::vector<int,_std::allocator<int>_>,_const_std::vector<int,_std::allocator<int>_>_>
          ::operator==(&local_28,&local_50);
  return bVar1;
}

Assistant:

constexpr auto impl_empty(const T& t, priority_tag<0>) -> bool
    {
      using std::begin;
      using std::end;
      return !(begin(t) != end(t));
    }